

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_primitive_field_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::RepeatedImmutablePrimitiveFieldLiteGenerator::
GenerateParsingCodeFromPacked(RepeatedImmutablePrimitiveFieldLiteGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  Type type;
  int iVar1;
  char *text;
  
  variables = &this->variables_;
  io::Printer::Print(printer,variables,
                     "int length = input.readRawVarint32();\nint limit = input.pushLimit(length);\nif (!$is_mutable$ && input.getBytesUntilLimit() > 0) {\n"
                    );
  type = GetType(this->descriptor_);
  iVar1 = FixedSize(type);
  text = 
  "  final int currentSize = $name$_.size();\n  $name$_ = $name$_.mutableCopyWithCapacity(\n      currentSize + (length/$fixed_size$));\n"
  ;
  if (iVar1 == -1) {
    text = "  $name$_ =\n      com.google.protobuf.GeneratedMessageLite.mutableCopy($name$_);\n";
  }
  io::Printer::Print(printer,variables,text);
  io::Printer::Print(printer,variables,
                     "}\nwhile (input.getBytesUntilLimit() > 0) {\n  $repeated_add$(input.read$capitalized_type$());\n}\ninput.popLimit(limit);\n"
                    );
  return;
}

Assistant:

void RepeatedImmutablePrimitiveFieldLiteGenerator::
GenerateParsingCodeFromPacked(io::Printer* printer) const {
  printer->Print(variables_,
    "int length = input.readRawVarint32();\n"
    "int limit = input.pushLimit(length);\n"
    "if (!$is_mutable$ && input.getBytesUntilLimit() > 0) {\n");

  int fixed_size = FixedSize(GetType(descriptor_));
  if (fixed_size == -1) {
    // TODO(dweis): Scan the input buffer to count, then initialize
    // appropriately.
    printer->Print(variables_,
      "  $name$_ =\n"
      "      com.google.protobuf.GeneratedMessageLite.mutableCopy($name$_);\n");
  } else {
    printer->Print(variables_,
      "  final int currentSize = $name$_.size();\n"
      "  $name$_ = $name$_.mutableCopyWithCapacity(\n"
      "      currentSize + (length/$fixed_size$));\n");
  }

  // TODO(dweis): Scan the input buffer to count and ensure capacity.
  printer->Print(variables_,
    "}\n"
    "while (input.getBytesUntilLimit() > 0) {\n"
    "  $repeated_add$(input.read$capitalized_type$());\n"
    "}\n"
    "input.popLimit(limit);\n");
}